

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O3

void __thiscall zmq::zmtp_engine_t::plug_internal(zmtp_engine_t *this)

{
  uchar *puVar1;
  byte bVar2;
  size_t sVar3;
  uchar *puVar4;
  ushort uVar5;
  
  stream_engine_base_t::set_handshake_timer(&this->super_stream_engine_base_t);
  (this->super_stream_engine_base_t)._outpos = this->_greeting_send;
  sVar3 = (this->super_stream_engine_base_t)._outsize;
  (this->super_stream_engine_base_t)._outsize = sVar3 + 1;
  this->_greeting_send[sVar3] = 0xff;
  puVar4 = (this->super_stream_engine_base_t)._outpos;
  sVar3 = (this->super_stream_engine_base_t)._outsize;
  bVar2 = (this->super_stream_engine_base_t)._options.routing_id_size;
  (puVar4 + sVar3 + 4)[0] = '\0';
  (puVar4 + sVar3 + 4)[1] = '\0';
  uVar5 = bVar2 + 1;
  puVar1 = puVar4 + sVar3;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  *(ushort *)(puVar4 + sVar3 + 6) = uVar5 * 0x100 | uVar5 >> 8;
  sVar3 = (this->super_stream_engine_base_t)._outsize;
  (this->super_stream_engine_base_t)._outsize = sVar3 + 9;
  (this->super_stream_engine_base_t)._outpos[sVar3 + 8] = '\x7f';
  io_object_t::set_pollin((io_object_t *)this,(this->super_stream_engine_base_t)._handle);
  io_object_t::set_pollout((io_object_t *)this,(this->super_stream_engine_base_t)._handle);
  stream_engine_base_t::in_event(&this->super_stream_engine_base_t);
  return;
}

Assistant:

void zmq::zmtp_engine_t::plug_internal ()
{
    // start optional timer, to prevent handshake hanging on no input
    set_handshake_timer ();

    //  Send the 'length' and 'flags' fields of the routing id message.
    //  The 'length' field is encoded in the long format.
    _outpos = _greeting_send;
    _outpos[_outsize++] = UCHAR_MAX;
    put_uint64 (&_outpos[_outsize], _options.routing_id_size + 1);
    _outsize += 8;
    _outpos[_outsize++] = 0x7f;

    set_pollin ();
    set_pollout ();
    //  Flush all the data that may have been already received downstream.
    in_event ();
}